

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O1

Mat * ncnn::Mat::from_pixels
                (Mat *__return_storage_ptr__,uchar *pixels,int type,int w,int h,int stride,
                Allocator *allocator)

{
  byte bVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  void *pvVar7;
  float *pfVar8;
  long lVar9;
  float *pfVar10;
  void *pvVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  float *pfVar15;
  float *pfVar16;
  void *pvVar17;
  int iVar18;
  void *pvVar19;
  byte *pbVar20;
  int iVar21;
  int iVar24;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Mat local_78;
  
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->c = 0;
  __return_storage_ptr__->cstep = 0;
  if ((uint)type < 0x10000) {
    if (type - 1U < 2) {
      from_rgb(pixels,w,h,stride,__return_storage_ptr__,allocator);
    }
    if (type == 3) {
      create(__return_storage_ptr__,w,h,1,4,allocator);
      pfVar8 = (float *)__return_storage_ptr__->data;
      if ((pfVar8 != (float *)0x0) &&
         ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
        iVar13 = 1;
        iVar24 = h;
        if (stride - w == 0) {
          iVar13 = h;
          iVar24 = 1;
        }
        if (0 < iVar24) {
          iVar18 = 0;
          pbVar20 = pixels;
          do {
            iVar21 = iVar13 * w + 1;
            if (0 < iVar13 * w) {
              do {
                *pfVar8 = (float)*pbVar20;
                pbVar20 = pbVar20 + 1;
                pfVar8 = pfVar8 + 1;
                iVar21 = iVar21 + -1;
              } while (1 < iVar21);
            }
            pbVar20 = pbVar20 + (stride - w);
            iVar18 = iVar18 + 1;
          } while (iVar18 != iVar24);
        }
      }
    }
    if ((type & 0xfffeU) != 4) {
      return __return_storage_ptr__;
    }
    create(__return_storage_ptr__,w,h,4,4,allocator);
    pfVar8 = (float *)__return_storage_ptr__->data;
    if (pfVar8 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar13 = stride + w * -4;
    iVar24 = 1;
    if (iVar13 == 0) {
      iVar24 = h;
      h = 1;
    }
    if (h < 1) {
      return __return_storage_ptr__;
    }
    lVar9 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
    pfVar15 = (float *)(lVar9 * 3 + (long)pfVar8);
    pfVar16 = (float *)((long)pfVar8 + lVar9 * 2);
    pfVar10 = (float *)(lVar9 + (long)pfVar8);
    iVar18 = 0;
    do {
      iVar21 = iVar24 * w + 1;
      if (0 < iVar24 * w) {
        do {
          *pfVar8 = (float)*pixels;
          *pfVar10 = (float)pixels[1];
          *pfVar16 = (float)pixels[2];
          *pfVar15 = (float)pixels[3];
          pixels = pixels + 4;
          pfVar8 = pfVar8 + 1;
          pfVar10 = pfVar10 + 1;
          pfVar16 = pfVar16 + 1;
          pfVar15 = pfVar15 + 1;
          iVar21 = iVar21 + -1;
        } while (1 < iVar21);
      }
      pixels = pixels + iVar13;
      iVar18 = iVar18 + 1;
    } while (iVar18 != h);
    return __return_storage_ptr__;
  }
  if (type < 0x30001) {
    switch(type) {
    case 0x10002:
switchD_0011db27_caseD_20001:
      from_rgb2bgr(pixels,w,h,stride,__return_storage_ptr__,allocator);
      return __return_storage_ptr__;
    case 0x10003:
switchD_0011db27_caseD_20003:
      from_gray2rgb(pixels,w,h,stride,__return_storage_ptr__,allocator);
      return __return_storage_ptr__;
    case 0x10004:
switchD_0011db27_caseD_20005:
      create(__return_storage_ptr__,w,h,3,4,allocator);
      pfVar8 = (float *)__return_storage_ptr__->data;
      if (pfVar8 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar13 = stride + w * -4;
      iVar24 = 1;
      if (iVar13 == 0) {
        iVar24 = h;
        h = 1;
      }
      if (h < 1) {
        return __return_storage_ptr__;
      }
      lVar9 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      pfVar16 = (float *)((long)pfVar8 + lVar9 * 2);
      pfVar10 = (float *)(lVar9 + (long)pfVar8);
      iVar18 = 0;
      do {
        iVar21 = iVar24 * w + 1;
        if (0 < iVar24 * w) {
          do {
            *pfVar8 = (float)*pixels;
            *pfVar10 = (float)pixels[1];
            *pfVar16 = (float)pixels[2];
            pixels = pixels + 4;
            pfVar8 = pfVar8 + 1;
            pfVar10 = pfVar10 + 1;
            pfVar16 = pfVar16 + 1;
            iVar21 = iVar21 + -1;
          } while (1 < iVar21);
        }
        pixels = pixels + iVar13;
        iVar18 = iVar18 + 1;
      } while (iVar18 != h);
      return __return_storage_ptr__;
    case 0x10005:
switchD_0011db27_caseD_20004:
      create(__return_storage_ptr__,w,h,3,4,allocator);
      pfVar8 = (float *)__return_storage_ptr__->data;
      if (pfVar8 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar13 = stride + w * -4;
      iVar24 = 1;
      if (iVar13 == 0) {
        iVar24 = h;
        h = 1;
      }
      if (h < 1) {
        return __return_storage_ptr__;
      }
      lVar9 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      pfVar16 = (float *)((long)pfVar8 + lVar9 * 2);
      pfVar10 = (float *)(lVar9 + (long)pfVar8);
      iVar18 = 0;
      do {
        iVar21 = iVar24 * w + 1;
        if (0 < iVar24 * w) {
          do {
            *pfVar8 = (float)pixels[2];
            *pfVar10 = (float)pixels[1];
            *pfVar16 = (float)*pixels;
            pixels = pixels + 4;
            pfVar8 = pfVar8 + 1;
            pfVar10 = pfVar10 + 1;
            pfVar16 = pfVar16 + 1;
            iVar21 = iVar21 + -1;
          } while (1 < iVar21);
        }
        pixels = pixels + iVar13;
        iVar18 = iVar18 + 1;
      } while (iVar18 != h);
      return __return_storage_ptr__;
    default:
      switch(type) {
      case 0x20001:
        goto switchD_0011db27_caseD_20001;
      default:
        return __return_storage_ptr__;
      case 0x20003:
        goto switchD_0011db27_caseD_20003;
      case 0x20004:
        goto switchD_0011db27_caseD_20004;
      case 0x20005:
        goto switchD_0011db27_caseD_20005;
      }
    }
  }
  switch(type) {
  case 0x30001:
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar8 = (float *)__return_storage_ptr__->data;
    if (pfVar8 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar13 = stride + w * -3;
    iVar24 = 1;
    if (iVar13 == 0) {
      iVar24 = h;
      h = 1;
    }
    if (h < 1) {
      return __return_storage_ptr__;
    }
    iVar18 = 0;
    do {
      iVar21 = iVar24 * w + 1;
      if (0 < iVar24 * w) {
        do {
          bVar1 = pixels[2];
          *pfVar8 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                            (uint)pixels[1] * 0x96 + (uint)*pixels * 0x4d >> 8);
          pixels = pixels + 3;
          pfVar8 = pfVar8 + 1;
          iVar21 = iVar21 + -1;
        } while (1 < iVar21);
      }
      pixels = pixels + iVar13;
      iVar18 = iVar18 + 1;
    } while (iVar18 != h);
    return __return_storage_ptr__;
  case 0x30002:
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar8 = (float *)__return_storage_ptr__->data;
    if (pfVar8 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar13 = stride + w * -3;
    iVar24 = 1;
    if (iVar13 == 0) {
      iVar24 = h;
      h = 1;
    }
    if (h < 1) {
      return __return_storage_ptr__;
    }
    iVar18 = 0;
    do {
      iVar21 = iVar24 * w + 1;
      if (0 < iVar24 * w) {
        do {
          bVar1 = *pixels;
          *pfVar8 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                            (uint)pixels[1] * 0x96 + (uint)pixels[2] * 0x4d >> 8);
          pixels = pixels + 3;
          pfVar8 = pfVar8 + 1;
          iVar21 = iVar21 + -1;
        } while (1 < iVar21);
      }
      pixels = pixels + iVar13;
      iVar18 = iVar18 + 1;
    } while (iVar18 != h);
    return __return_storage_ptr__;
  case 0x30003:
    return __return_storage_ptr__;
  case 0x30004:
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar8 = (float *)__return_storage_ptr__->data;
    if (pfVar8 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar13 = stride + w * -4;
    iVar24 = 1;
    if (iVar13 == 0) {
      iVar24 = h;
      h = 1;
    }
    if (h < 1) {
      return __return_storage_ptr__;
    }
    iVar18 = 0;
    do {
      iVar21 = iVar24 * w + 1;
      if (0 < iVar24 * w) {
        do {
          bVar1 = pixels[2];
          *pfVar8 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                            (uint)pixels[1] * 0x96 + (uint)*pixels * 0x4d >> 8);
          pixels = pixels + 4;
          pfVar8 = pfVar8 + 1;
          iVar21 = iVar21 + -1;
        } while (1 < iVar21);
      }
      pixels = pixels + iVar13;
      iVar18 = iVar18 + 1;
    } while (iVar18 != h);
    return __return_storage_ptr__;
  case 0x30005:
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar8 = (float *)__return_storage_ptr__->data;
    if (pfVar8 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar13 = stride + w * -4;
    iVar24 = 1;
    if (iVar13 == 0) {
      iVar24 = h;
      h = 1;
    }
    if (h < 1) {
      return __return_storage_ptr__;
    }
    iVar18 = 0;
    do {
      iVar21 = iVar24 * w + 1;
      if (0 < iVar24 * w) {
        do {
          bVar1 = *pixels;
          *pfVar8 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                            (uint)pixels[1] * 0x96 + (uint)pixels[2] * 0x4d >> 8);
          pixels = pixels + 4;
          pfVar8 = pfVar8 + 1;
          iVar21 = iVar21 + -1;
        } while (1 < iVar21);
      }
      pixels = pixels + iVar13;
      iVar18 = iVar18 + 1;
    } while (iVar18 != h);
    return __return_storage_ptr__;
  }
  switch(type) {
  case 0x40001:
switchD_0011daf6_caseD_50002:
    create(__return_storage_ptr__,w,h,4,4,allocator);
    local_78.data = __return_storage_ptr__->data;
    if (local_78.data == (void *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    local_78.cstep = __return_storage_ptr__->elemsize;
    local_78.elempack = __return_storage_ptr__->elempack;
    local_78.allocator = __return_storage_ptr__->allocator;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = (undefined4)local_78.cstep;
    local_78.elemsize._4_4_ = (undefined4)(local_78.cstep >> 0x20);
    local_78.w = __return_storage_ptr__->w;
    local_78.dims = 3;
    local_78.c = 3;
    local_78.h = __return_storage_ptr__->h;
    local_78.cstep =
         ((long)(__return_storage_ptr__->h * __return_storage_ptr__->w) * local_78.cstep + 0xf &
         0xfffffffffffffff0) / local_78.cstep;
    from_rgb(pixels,w,h,stride,&local_78,allocator);
    auVar5 = _DAT_00178b90;
    auVar4 = _DAT_00178b80;
    auVar3 = _DAT_00178b70;
    uVar6 = __return_storage_ptr__->h * __return_storage_ptr__->w;
    if (0 < (int)uVar6) {
      pvVar7 = __return_storage_ptr__->data;
      lVar9 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      lVar14 = (ulong)uVar6 - 1;
      auVar22._8_4_ = (int)lVar14;
      auVar22._0_8_ = lVar14;
      auVar22._12_4_ = (int)((ulong)lVar14 >> 0x20);
      uVar12 = 0;
      auVar22 = auVar22 ^ _DAT_00178b70;
      do {
        auVar25._8_4_ = (int)uVar12;
        auVar25._0_8_ = uVar12;
        auVar25._12_4_ = (int)(uVar12 >> 0x20);
        auVar23 = (auVar25 | auVar5) ^ auVar3;
        iVar24 = auVar22._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar24 && auVar22._0_4_ < auVar23._0_4_ ||
                    iVar24 < auVar23._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3) = 0x437f0000;
        }
        if ((auVar23._12_4_ != auVar22._12_4_ || auVar23._8_4_ <= auVar22._8_4_) &&
            auVar23._12_4_ <= auVar22._12_4_) {
          *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3 + 4) = 0x437f0000;
        }
        auVar23 = (auVar25 | auVar4) ^ auVar3;
        iVar13 = auVar23._4_4_;
        if (iVar13 <= iVar24 && (iVar13 != iVar24 || auVar23._0_4_ <= auVar22._0_4_)) {
          *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3 + 8) = 0x437f0000;
          *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3 + 0xc) = 0x437f0000;
        }
        uVar12 = uVar12 + 4;
      } while ((uVar6 + 3 & 0xfffffffc) != uVar12);
    }
    piVar2 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar2 == (int *)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 != 0) {
      return __return_storage_ptr__;
    }
    if (local_78.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_78.allocator + 0x18))();
      return __return_storage_ptr__;
    }
    break;
  case 0x40002:
switchD_0011daf6_caseD_50001:
    create(__return_storage_ptr__,w,h,4,4,allocator);
    local_78.data = __return_storage_ptr__->data;
    if (local_78.data == (void *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    local_78.cstep = __return_storage_ptr__->elemsize;
    local_78.elempack = __return_storage_ptr__->elempack;
    local_78.allocator = __return_storage_ptr__->allocator;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = (undefined4)local_78.cstep;
    local_78.elemsize._4_4_ = (undefined4)(local_78.cstep >> 0x20);
    local_78.w = __return_storage_ptr__->w;
    local_78.dims = 3;
    local_78.c = 3;
    local_78.h = __return_storage_ptr__->h;
    local_78.cstep =
         ((long)(__return_storage_ptr__->h * __return_storage_ptr__->w) * local_78.cstep + 0xf &
         0xfffffffffffffff0) / local_78.cstep;
    from_rgb2bgr(pixels,w,h,stride,&local_78,allocator);
    auVar5 = _DAT_00178b90;
    auVar4 = _DAT_00178b80;
    auVar3 = _DAT_00178b70;
    uVar6 = __return_storage_ptr__->h * __return_storage_ptr__->w;
    if (0 < (int)uVar6) {
      pvVar7 = __return_storage_ptr__->data;
      lVar9 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      lVar14 = (ulong)uVar6 - 1;
      auVar28._8_4_ = (int)lVar14;
      auVar28._0_8_ = lVar14;
      auVar28._12_4_ = (int)((ulong)lVar14 >> 0x20);
      uVar12 = 0;
      auVar28 = auVar28 ^ _DAT_00178b70;
      do {
        auVar27._8_4_ = (int)uVar12;
        auVar27._0_8_ = uVar12;
        auVar27._12_4_ = (int)(uVar12 >> 0x20);
        auVar23 = (auVar27 | auVar5) ^ auVar3;
        iVar24 = auVar28._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar24 && auVar28._0_4_ < auVar23._0_4_ ||
                    iVar24 < auVar23._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3) = 0x437f0000;
        }
        if ((auVar23._12_4_ != auVar28._12_4_ || auVar23._8_4_ <= auVar28._8_4_) &&
            auVar23._12_4_ <= auVar28._12_4_) {
          *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3 + 4) = 0x437f0000;
        }
        auVar23 = (auVar27 | auVar4) ^ auVar3;
        iVar13 = auVar23._4_4_;
        if (iVar13 <= iVar24 && (iVar13 != iVar24 || auVar23._0_4_ <= auVar28._0_4_)) {
          *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3 + 8) = 0x437f0000;
          *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3 + 0xc) = 0x437f0000;
        }
        uVar12 = uVar12 + 4;
      } while ((uVar6 + 3 & 0xfffffffc) != uVar12);
    }
    piVar2 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar2 == (int *)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 != 0) {
      return __return_storage_ptr__;
    }
    if (local_78.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_78.allocator + 0x18))();
      return __return_storage_ptr__;
    }
    break;
  case 0x40003:
switchD_0011daf6_caseD_50003:
    create(__return_storage_ptr__,w,h,4,4,allocator);
    local_78.data = __return_storage_ptr__->data;
    if (local_78.data == (void *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    local_78.cstep = __return_storage_ptr__->elemsize;
    local_78.elempack = __return_storage_ptr__->elempack;
    local_78.allocator = __return_storage_ptr__->allocator;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = (undefined4)local_78.cstep;
    local_78.elemsize._4_4_ = (undefined4)(local_78.cstep >> 0x20);
    local_78.w = __return_storage_ptr__->w;
    local_78.dims = 3;
    local_78.c = 3;
    local_78.h = __return_storage_ptr__->h;
    local_78.cstep =
         ((long)(__return_storage_ptr__->h * __return_storage_ptr__->w) * local_78.cstep + 0xf &
         0xfffffffffffffff0) / local_78.cstep;
    from_gray2rgb(pixels,w,h,stride,&local_78,allocator);
    auVar5 = _DAT_00178b90;
    auVar4 = _DAT_00178b80;
    auVar3 = _DAT_00178b70;
    uVar6 = __return_storage_ptr__->h * __return_storage_ptr__->w;
    if (0 < (int)uVar6) {
      pvVar7 = __return_storage_ptr__->data;
      lVar9 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      lVar14 = (ulong)uVar6 - 1;
      auVar23._8_4_ = (int)lVar14;
      auVar23._0_8_ = lVar14;
      auVar23._12_4_ = (int)((ulong)lVar14 >> 0x20);
      uVar12 = 0;
      auVar23 = auVar23 ^ _DAT_00178b70;
      do {
        auVar26._8_4_ = (int)uVar12;
        auVar26._0_8_ = uVar12;
        auVar26._12_4_ = (int)(uVar12 >> 0x20);
        auVar28 = (auVar26 | auVar5) ^ auVar3;
        iVar24 = auVar23._4_4_;
        if ((bool)(~(auVar28._4_4_ == iVar24 && auVar23._0_4_ < auVar28._0_4_ ||
                    iVar24 < auVar28._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3) = 0x437f0000;
        }
        if ((auVar28._12_4_ != auVar23._12_4_ || auVar28._8_4_ <= auVar23._8_4_) &&
            auVar28._12_4_ <= auVar23._12_4_) {
          *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3 + 4) = 0x437f0000;
        }
        auVar26 = (auVar26 | auVar4) ^ auVar3;
        iVar13 = auVar26._4_4_;
        if (iVar13 <= iVar24 && (iVar13 != iVar24 || auVar26._0_4_ <= auVar23._0_4_)) {
          *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3 + 8) = 0x437f0000;
          *(undefined4 *)((long)pvVar7 + uVar12 * 4 + lVar9 * 3 + 0xc) = 0x437f0000;
        }
        uVar12 = uVar12 + 4;
      } while ((uVar6 + 3 & 0xfffffffc) != uVar12);
    }
    piVar2 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar2 == (int *)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 != 0) {
      return __return_storage_ptr__;
    }
    if (local_78.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_78.allocator + 0x18))();
      return __return_storage_ptr__;
    }
    break;
  case 0x40004:
    return __return_storage_ptr__;
  case 0x40005:
switchD_0011daf6_caseD_50004:
    create(__return_storage_ptr__,w,h,4,4,allocator);
    pvVar7 = __return_storage_ptr__->data;
    if (pvVar7 == (void *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar13 = stride + w * -4;
    iVar24 = 1;
    if (iVar13 == 0) {
      iVar24 = h;
      h = 1;
    }
    if (h < 1) {
      return __return_storage_ptr__;
    }
    lVar9 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
    pvVar17 = (void *)(lVar9 * 3 + (long)pvVar7);
    pvVar19 = (void *)((long)pvVar7 + lVar9 * 2);
    pvVar11 = (void *)(lVar9 + (long)pvVar7);
    iVar18 = 0;
    do {
      if (0 < iVar24 * w) {
        lVar9 = 0;
        iVar21 = iVar24 * w + 1;
        do {
          *(float *)((long)pvVar7 + lVar9) = (float)pixels[lVar9 + 2];
          *(float *)((long)pvVar11 + lVar9) = (float)pixels[lVar9 + 1];
          *(float *)((long)pvVar19 + lVar9) = (float)pixels[lVar9];
          *(float *)((long)pvVar17 + lVar9) = (float)pixels[lVar9 + 3];
          iVar21 = iVar21 + -1;
          lVar9 = lVar9 + 4;
        } while (1 < iVar21);
        pvVar17 = (void *)((long)pvVar17 + lVar9);
        pvVar19 = (void *)((long)pvVar19 + lVar9);
        pvVar11 = (void *)((long)pvVar11 + lVar9);
        pvVar7 = (void *)((long)pvVar7 + lVar9);
        pixels = pixels + lVar9;
      }
      pixels = pixels + iVar13;
      iVar18 = iVar18 + 1;
    } while (iVar18 != h);
    return __return_storage_ptr__;
  default:
    switch(type) {
    case 0x50001:
      goto switchD_0011daf6_caseD_50001;
    case 0x50002:
      goto switchD_0011daf6_caseD_50002;
    case 0x50003:
      goto switchD_0011daf6_caseD_50003;
    case 0x50004:
      goto switchD_0011daf6_caseD_50004;
    default:
      return __return_storage_ptr__;
    }
  }
  if (local_78.data != (void *)0x0) {
    free(local_78.data);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_pixels(const unsigned char* pixels, int type, int w, int h, int stride, Allocator* allocator)
{
    Mat m;

    if (type & PIXEL_CONVERT_MASK)
    {
        switch (type)
        {
        case PIXEL_RGB2BGR:
        case PIXEL_BGR2RGB:
            from_rgb2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2GRAY:
            from_rgb2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2RGBA:
        case PIXEL_BGR2BGRA:
            from_rgb2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2GRAY:
            from_bgr2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2RGBA:
        case PIXEL_RGB2BGRA:
            from_bgr2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGB:
        case PIXEL_GRAY2BGR:
            from_gray2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGBA:
        case PIXEL_GRAY2BGRA:
            from_gray2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2RGB:
        case PIXEL_BGRA2BGR:
            from_rgba2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGR:
        case PIXEL_BGRA2RGB:
            from_rgba2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2GRAY:
            from_rgba2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGRA:
        case PIXEL_BGRA2RGBA:
            from_rgba2bgra(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGRA2GRAY:
            from_bgra2gray(pixels, w, h, stride, m, allocator);
            break;
        default:
            // unimplemented convert type
            break;
        }
    }
    else
    {
        if (type == PIXEL_RGB || type == PIXEL_BGR)
            from_rgb(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_GRAY)
            from_gray(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_RGBA || type == PIXEL_BGRA)
            from_rgba(pixels, w, h, stride, m, allocator);
    }

    return m;
}